

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

DeviceInfo * __thiscall AdsDevice::GetDeviceInfo(DeviceInfo *__return_storage_ptr__,AdsDevice *this)

{
  long lVar1;
  AdsException *this_00;
  DeviceInfo *info;
  long error;
  AdsDevice *this_local;
  
  lVar1 = GetLocalPort(this);
  lVar1 = AdsSyncReadDeviceInfoReqEx
                    (lVar1,&this->m_Addr,__return_storage_ptr__->name,
                     &__return_storage_ptr__->version);
  if (lVar1 != 0) {
    this_00 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(this_00,lVar1);
    __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
  }
  return __return_storage_ptr__;
}

Assistant:

DeviceInfo AdsDevice::GetDeviceInfo() const
{
    DeviceInfo info;
    auto error = AdsSyncReadDeviceInfoReqEx(GetLocalPort(),
                                            &m_Addr,
                                            &info.name[0],
                                            &info.version);

    if (error) {
        throw AdsException(error);
    }
    return info;
}